

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  long lVar1;
  int iVar2;
  Expr *pA;
  char *in_RCX;
  int *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Expr *pE2;
  Expr *pE;
  int nResult;
  Parse *pParse;
  ExprList_item *pItem;
  int j;
  int i;
  int iCol;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  Parse *pParse_01;
  Select *pSelect_00;
  int iVar4;
  int iVar5;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -0x55555556;
  local_c = -0x55555556;
  uVar3 = **(undefined4 **)(in_RSI + 0x20);
  pParse_01 = (Parse *)*in_RDI;
  iVar5 = 0;
  pSelect_00 = (Select *)(in_RDX + 2);
  do {
    if (*in_RDX <= iVar5) {
      local_10 = sqlite3ResolveOrderGroupBy
                           ((Parse *)CONCAT44(iVar5,iVar4),pSelect_00,(ExprList *)pParse_01,
                            (char *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
LAB_001dd388:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_10;
    }
    pParse_00 = *(Parse **)pSelect_00;
    pA = sqlite3ExprSkipCollateAndLikely((Expr *)pParse_00);
    if (pA != (Expr *)0x0) {
      if ((*in_RCX == 'G') ||
         (local_c = resolveAsName(pParse_01,(ExprList *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                                  (Expr *)pParse_00), local_c < 1)) {
        iVar2 = sqlite3ExprIsInteger
                          ((Expr *)pSelect_00,(int *)pParse_01,
                           (Parse *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
        if (iVar2 == 0) {
          *(undefined2 *)pSelect_00->addrOpenEphm = 0;
          iVar4 = sqlite3ResolveExprNames
                            ((NameContext *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                             (Expr *)pParse_00);
          if (iVar4 != 0) {
            local_10 = 1;
            goto LAB_001dd388;
          }
          for (iVar4 = 0; iVar4 < **(int **)(in_RSI + 0x20); iVar4 = iVar4 + 1) {
            iVar2 = sqlite3ExprCompare(pParse_00,pA,
                                       (Expr *)CONCAT44(in_stack_ffffffffffffff9c,
                                                        in_stack_ffffffffffffff98),0);
            if (iVar2 == 0) {
              windowRemoveExprFromSelect
                        ((Select *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (Expr *)0x1dd329);
              *(short *)pSelect_00->addrOpenEphm = (short)iVar4 + 1;
            }
          }
        }
        else {
          if ((local_c < 1) || (0xffff < local_c)) {
            resolveOutOfRangeError
                      ((Parse *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),(char *)pParse_00,
                       (int)((ulong)pA >> 0x20),(int)pA,
                       (Expr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            local_10 = 1;
            goto LAB_001dd388;
          }
          *(short *)pSelect_00->addrOpenEphm = (short)local_c;
        }
      }
      else {
        *(short *)pSelect_00->addrOpenEphm = (short)local_c;
      }
    }
    iVar5 = iVar5 + 1;
    pSelect_00 = (Select *)(pSelect_00->addrOpenEphm + 1);
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  assert( pOrderBy!=0 );
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pE);
    if( NEVER(pE2==0) ) continue;
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol, 0) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult, pE2);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expression is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        windowRemoveExprFromSelect(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}